

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O1

uint ON_RowReduce(uint row_count,uint col_count,double zero_pivot_tolerance,double **constA,
                 bool bInitializeB,bool bInitializeColumnPermutation,double **A,double **B,
                 uint *column_permutation,double *pivots)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  uint uVar6;
  ON_Matrix *this;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  if (pivots != (double *)0x0) {
    pivots[1] = -1.0;
    *pivots = -1.0;
    pivots[2] = 0.0;
  }
  if (B == (double **)0x0 || (col_count + 1 < 2 || row_count + 1 < 2)) {
    return 0xffffffff;
  }
  uVar10 = (ulong)row_count;
  if (bInitializeB && row_count != 0) {
    uVar9 = 0;
    do {
      pdVar2 = B[uVar9];
      memset(pdVar2,0,uVar10 * 8);
      pdVar2[uVar9] = 1.0;
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  if ((bInitializeColumnPermutation && row_count != 0) && column_permutation != (uint *)0x0) {
    uVar9 = 0;
    do {
      column_permutation[uVar9] = (uint)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  if (A == (double **)0x0) {
    if (constA == (double **)0x0) {
      uVar6 = 0xffffffff;
      this = (ON_Matrix *)0x0;
      goto LAB_004fb0b8;
    }
    this = (ON_Matrix *)operator_new(0x48);
    ON_Matrix::ON_Matrix(this,row_count,col_count);
    A = this->m;
  }
  else {
    this = (ON_Matrix *)0x0;
  }
  if (row_count != 0 && (A != (double **)0x0 && constA != (double **)0x0)) {
    uVar9 = 0;
    do {
      pdVar2 = constA[uVar9];
      pdVar8 = A[uVar9];
      uVar11 = 0;
      do {
        pdVar8[uVar11] = pdVar2[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar10);
  }
  uVar6 = col_count;
  if (row_count < col_count) {
    uVar6 = row_count;
  }
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    pdVar2 = pivots + 1;
    uVar11 = 1;
    dVar18 = -1.0;
    dVar16 = -1.0;
    uVar9 = 0;
    do {
      uVar14 = uVar9 & 0xffffffff;
      dVar20 = -1.0;
      uVar7 = uVar9;
      uVar13 = uVar9;
      do {
        uVar12 = uVar9;
        dVar21 = dVar20;
        do {
          dVar20 = ABS(A[uVar7][uVar12]);
          uVar15 = uVar13;
          if (dVar21 < dVar20) {
            uVar14 = uVar7 & 0xffffffff;
            uVar15 = uVar12;
          }
          uVar13 = uVar15 & 0xffffffff;
          if (dVar20 <= dVar21) {
            dVar20 = dVar21;
          }
          uVar12 = uVar12 + 1;
          dVar21 = dVar20;
        } while (uVar12 < col_count);
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar10);
      if (dVar20 < 0.0) {
        uVar9 = 0xffffffff;
        goto LAB_004fb0a9;
      }
      dVar21 = dVar16;
      if (pivots != (double *)0x0) {
        dVar21 = *pivots;
      }
      dVar17 = dVar16;
      dVar19 = dVar18;
      if ((dVar21 < 0.0) && (dVar17 = dVar20, dVar19 = dVar20, pivots != (double *)0x0)) {
        *pdVar2 = dVar20;
        *pivots = dVar20;
        dVar17 = dVar16;
        dVar19 = dVar18;
      }
      if (dVar20 <= (double)(-(ulong)(0.0 <= zero_pivot_tolerance) & (ulong)zero_pivot_tolerance)) {
        if (pivots != (double *)0x0) {
          pivots[2] = dVar20;
        }
        goto LAB_004fb0a9;
      }
      dVar18 = dVar17;
      if (pivots != (double *)0x0) {
        dVar18 = *pivots;
      }
      dVar16 = dVar17;
      if (dVar20 <= dVar18) {
        dVar21 = dVar19;
        if (pivots != (double *)0x0) {
          dVar21 = *pdVar2;
        }
        dVar18 = (double)(~-(ulong)(dVar21 <= dVar20) & (ulong)dVar20 |
                         -(ulong)(dVar21 <= dVar20) & (ulong)dVar19);
        if ((pivots != (double *)0x0) && (pdVar8 = pdVar2, dVar20 < dVar21)) goto LAB_004faf69;
      }
      else {
        pdVar8 = pivots;
        dVar16 = dVar20;
        dVar18 = dVar19;
        if (pivots != (double *)0x0) {
LAB_004faf69:
          *pdVar8 = dVar20;
          dVar16 = dVar17;
          dVar18 = dVar19;
        }
      }
      pdVar8 = A[uVar14];
      pdVar3 = B[uVar14];
      if (uVar9 < uVar14) {
        A[uVar14] = A[uVar9];
        A[uVar9] = pdVar8;
        B[uVar14] = B[uVar9];
        B[uVar9] = pdVar3;
        if (column_permutation != (uint *)0x0) {
          uVar1 = column_permutation[uVar14];
          column_permutation[uVar14] = column_permutation[uVar9];
          column_permutation[uVar9] = uVar1;
        }
      }
      uVar15 = uVar15 & 0xffffffff;
      dVar20 = pdVar8[uVar15];
      pdVar8[uVar15] = pdVar8[uVar9];
      uVar14 = uVar9 + 1;
      if (uVar14 < uVar10) {
        uVar7 = uVar11;
        do {
          pdVar4 = A[uVar7];
          dVar21 = pdVar4[uVar15] / -dVar20;
          pdVar4[uVar15] = pdVar4[uVar9];
          if ((dVar21 != 0.0) || (NAN(dVar21))) {
            pdVar5 = B[uVar7];
            uVar13 = 0;
            do {
              pdVar5[uVar13] = pdVar3[uVar13] * dVar21 + pdVar5[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar11 != uVar13);
            if ((uint)uVar13 < col_count) {
              do {
                pdVar5[uVar13] = pdVar3[uVar13] * dVar21 + pdVar5[uVar13];
                pdVar4[uVar13] = pdVar8[uVar13] * dVar21 + pdVar4[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar13 < col_count);
            }
          }
          uVar7 = uVar7 + 1;
        } while ((uint)uVar7 != row_count);
      }
      uVar11 = uVar11 + 1;
      uVar9 = uVar14;
    } while (uVar14 != uVar6);
    uVar9 = (ulong)uVar6;
LAB_004fb0a9:
    uVar6 = (uint)uVar9;
  }
LAB_004fb0b8:
  if (this != (ON_Matrix *)0x0) {
    (*this->_vptr_ON_Matrix[1])();
  }
  return uVar6;
}

Assistant:

unsigned int ON_RowReduce(
  unsigned int row_count,
  unsigned int col_count,
  double zero_pivot_tolerance,
  const double*const* constA,
  bool bInitializeB,
  bool bInitializeColumnPermutation,
  double** A,
  double** B,
  unsigned int* column_permutation,
  double pivots[3]
  )
{
  double pivots_buffer[3];
  if (nullptr == pivots)
    pivots = pivots_buffer;
  pivots[0] = pivots[1] = -1.0;
  pivots[2] = 0.0;

  if (row_count < 1 || ON_UNSET_UINT_INDEX == row_count)
    return ON_UNSET_UINT_INDEX;

  if (col_count < 1 || ON_UNSET_UINT_INDEX == col_count)
    return ON_UNSET_UINT_INDEX;

  if (nullptr == B)
    return ON_UNSET_UINT_INDEX;

  unsigned int i, j;
  double* a;
  double* b;

  if (bInitializeB)
  {
    for (i = 0; i < row_count; i++)
    {
      b = B[i];
      for (j = 0; j < row_count; j++)
        b[j] = 0.0;
      b[i] = 1.0;
    }
  }

  if (bInitializeColumnPermutation && nullptr != column_permutation)
  {
    for (j = 0; j < row_count; j++)
      column_permutation[j] = j;
  }

  if (!(zero_pivot_tolerance >= 0.0))
    zero_pivot_tolerance = 0.0;

  std::unique_ptr< ON_Matrix > uA;
  if (nullptr == A)
  {
    if (nullptr == constA)
      return ON_UNSET_UINT_INDEX;
    uA = std::unique_ptr< ON_Matrix >(new ON_Matrix(row_count, col_count));
    A = uA.get()->m;
  }

  if (nullptr != constA && nullptr != A)
  {
    for (i = 0; i < row_count; i++)
    {
      const double* c = constA[i];
      a = A[i];
      for (j = 0; j < row_count; j++)
        a[j] = c[j];
    }
  }

  double* r;
  double* s;
  double x, xx;
  unsigned int ii, jj;
  ii = jj = 0;
  xx = fabs(A[ii][jj]);
  unsigned int rank;
  for (rank = 0; rank < row_count; rank++)
  {
    if (rank >= col_count)
      return rank;

    xx = -1.0;
    ii = jj = rank;
    for (i = rank; i < row_count; i++)
    {
      r = A[i];
      for (j = rank; j < col_count; j++)
      {
        x = fabs(r[j]);
        if (x > xx)
        {
          ii = i;
          jj = j;
          xx = x;
        }
      }
    }

    if (!(xx >= 0.0))
      return ON_UNSET_UINT_INDEX;

    if (pivots[0] < 0.0)
      pivots[0] = pivots[1] = xx;

    if (xx <= zero_pivot_tolerance)
    {
      pivots[2] = xx;
      return rank;
    }

    if (xx > pivots[0])
      pivots[0] = xx;
    else if (xx < pivots[1])
      pivots[1] = xx;


    a = A[ii];
    b = B[ii];
    if (ii > rank)
    {
      // swap rows M[ii] and M[rank] so maximum coefficient is in M[rank][jj]
      A[ii] = A[rank];
      A[rank] = a;
      B[ii] = B[rank];
      B[rank] = b;
      if (nullptr != column_permutation)
      {
        j = column_permutation[ii];
        column_permutation[ii] = column_permutation[rank];
        column_permutation[rank] = j;
      }
    }

    // swap columns M[jj] and M[rank] to maximum coefficient is in M[rank][rank]
    xx = -a[jj];
    a[jj] = a[rank];
    //a[rank] = -xx; // DEBUG

    for (i = rank + 1; i < row_count; i++)
    {
      // swap columns M[jj] and M[rank] 
      r = A[i];
      x = r[jj] / xx;
      //double dd = r[jj]; // DEBUG
      r[jj] = r[rank];
      //r[rank] = dd; // DEBUG

      // Use row operation
      // M[i] = M[i] - (row[i]/M[rank][rank])*M[rank]
      // to M[i][rank]
      if (0.0 != x)
      {
        s = B[i];
        for (j = 0; j <= rank; j++)
        {
          s[j] += x*b[j];
          //r[j] += x*a[j]; // DEBUG
        }
        for (/*empty init*/; j < col_count; j++)
        {
          s[j] += x*b[j];
          r[j] += x*a[j];
        }
      }
    }
  }
  return rank;
}